

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPUDPv4Transmitter::PollSocket(RTPUDPv4Transmitter *this,bool rtp)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  ssize_t sVar4;
  RTPIPv4Address *obj;
  uint8_t *__dest;
  undefined7 in_register_00000031;
  RTCPCommonHeader *rtcpheader;
  uint uVar5;
  undefined1 uVar6;
  RTPTime RVar7;
  int sock;
  uint fromlen;
  int8_t isset;
  int iStack_10070;
  int iStack_1006c;
  size_t len;
  sockaddr_in srcaddr;
  char packetbuffer [65535];
  ulong numbytes;
  
  iStack_10070 = (int)CONCAT71(in_register_00000031,rtp);
  sock = *(int *)((long)(this->destinations).table + (ulong)!rtp * 4 + -0x54);
  iStack_1006c = 2 - iStack_10070;
  do {
    len = 0;
    ioctl(sock,0x541b,&len);
    if (len == 0) {
      _isset = (value_type)((ulong)_isset & 0xffffffffffffff00);
      iVar3 = RTPSelect(&sock,&isset,1,(RTPTime)0x0);
      if (iVar3 < 0) {
        return iVar3;
      }
      if (isset == '\0') {
        return 0;
      }
    }
    RVar7 = RTPTime::CurrentTime();
    fromlen = 0x10;
    sVar4 = recvfrom(sock,packetbuffer,0xffff,0,(sockaddr *)&srcaddr,&fromlen);
    if ((0 < (int)(uint)sVar4) &&
       ((this->receivemode == AcceptAll ||
        (bVar1 = ShouldAcceptData(this,srcaddr.sin_addr.s_addr >> 0x18 |
                                       (srcaddr.sin_addr.s_addr & 0xff0000) >> 8 |
                                       (srcaddr.sin_addr.s_addr & 0xff00) << 8 |
                                       srcaddr.sin_addr.s_addr << 0x18,
                                  srcaddr.sin_port << 8 | srcaddr.sin_port >> 8), bVar1)))) {
      obj = (RTPIPv4Address *)
            operator_new(0x18,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x17);
      uVar2 = srcaddr.sin_port << 8 | srcaddr.sin_port >> 8;
      (obj->super_RTPAddress).addresstype = IPv4Address;
      (obj->super_RTPAddress)._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_00144ce0;
      *(in_addr_t *)&(obj->super_RTPAddress).field_0xc =
           srcaddr.sin_addr.s_addr >> 0x18 | (srcaddr.sin_addr.s_addr & 0xff0000) >> 8 |
           (srcaddr.sin_addr.s_addr & 0xff00) << 8 | srcaddr.sin_addr.s_addr << 0x18;
      obj->port = uVar2;
      obj->rtcpsendport = uVar2 + 1;
      uVar5 = (uint)sVar4 & 0x7fffffff;
      numbytes = (ulong)uVar5;
      __dest = (uint8_t *)
               operator_new__(numbytes,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,
                              iStack_1006c);
      if (__dest == (uint8_t *)0x0) {
        RTPDelete<jrtplib::RTPIPv4Address>
                  (obj,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
        return -1;
      }
      memcpy(__dest,packetbuffer,numbytes);
      uVar6 = (undefined1)iStack_10070;
      if ((this->rtpsock == this->rtcpsock) && (uVar6 = true, 4 < uVar5)) {
        uVar6 = (byte)(__dest[1] + 0x33) < 0xfb;
      }
      _isset = (value_type)
               operator_new(0x38,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1b);
      (_isset->super_RTPMemoryObject).mgr = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      (_isset->super_RTPMemoryObject)._vptr_RTPMemoryObject =
           (_func_int **)&PTR__RTPRawPacket_00145040;
      (_isset->receivetime).m_t = RVar7.m_t;
      _isset->packetdata = __dest;
      _isset->packetdatalength = numbytes;
      _isset->senderaddress = (RTPAddress *)obj;
      _isset->isrtp = (bool)uVar6;
      std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
      push_back(&this->rawpacketlist,(value_type *)&isset);
    }
  } while( true );
}

Assistant:

int RTPUDPv4Transmitter::PollSocket(bool rtp)
{
	RTPSOCKLENTYPE fromlen;
	int recvlen;
	char packetbuffer[RTPUDPV4TRANS_MAXPACKSIZE];
#ifdef RTP_SOCKETTYPE_WINSOCK
	SOCKET sock;
	unsigned long len;
#else 
	size_t len;
	int sock;
#endif // RTP_SOCKETTYPE_WINSOCK
	struct sockaddr_in srcaddr;
	bool dataavailable;
	
	if (rtp)
		sock = rtpsock;
	else
		sock = rtcpsock;
	
	do
	{
		len = 0;
		RTPIOCTL(sock,FIONREAD,&len);

		if (len <= 0) // make sure a packet of length zero is not queued
		{
			// An alternative workaround would be to just use non-blocking sockets.
			// However, since the user does have access to the sockets and I do not
			// know how this would affect anyone else's code, I chose to do it using
			// an extra select call in case ioctl says the length is zero.
			
			int8_t isset = 0;
			int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
			if (status < 0)
				return status;

			if (isset)
				dataavailable = true;
			else
				dataavailable = false;
		}
		else
			dataavailable = true;
		
		if (dataavailable)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			fromlen = sizeof(struct sockaddr_in);
			recvlen = recvfrom(sock,packetbuffer,RTPUDPV4TRANS_MAXPACKSIZE,0,(struct sockaddr *)&srcaddr,&fromlen);
			if (recvlen > 0)
			{
				bool acceptdata;

				// got data, process it
				if (receivemode == RTPTransmitter::AcceptAll)
					acceptdata = true;
				else
					acceptdata = ShouldAcceptData(ntohl(srcaddr.sin_addr.s_addr),ntohs(srcaddr.sin_port));
				
				if (acceptdata)
				{
					RTPRawPacket *pack;
					RTPIPv4Address *addr;
					uint8_t *datacopy;

					addr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv4Address(ntohl(srcaddr.sin_addr.s_addr),ntohs(srcaddr.sin_port));
					if (addr == 0)
						return ERR_RTP_OUTOFMEM;
					datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[recvlen];
					if (datacopy == 0)
					{
						RTPDelete(addr,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(datacopy,packetbuffer,recvlen);
					
					bool isrtp = rtp;
					if (rtpsock == rtcpsock) // check payload type when multiplexing
					{
						isrtp = true;

						if ((size_t)recvlen > sizeof(RTCPCommonHeader))
						{
							RTCPCommonHeader *rtcpheader = (RTCPCommonHeader *)datacopy;
							uint8_t packettype = rtcpheader->packettype;

    						if (packettype >= 200 && packettype <= 204)
								isrtp = false;
						}
					}
						
					pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,recvlen,addr,curtime,isrtp,GetMemoryManager());
					if (pack == 0)
					{
						RTPDelete(addr,GetMemoryManager());
						RTPDeleteByteArray(datacopy,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					rawpacketlist.push_back(pack);	
				}
			}
		}
	} while (dataavailable);

	return 0;
}